

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O0

void __thiscall irr::video::CImage::fill(CImage *this,SColor *color)

{
  long lVar1;
  void *dest;
  bool bVar2;
  u16 uVar3;
  u32 uVar4;
  u32 uVar5;
  u32 *in_RSI;
  long in_RDI;
  double __x;
  u32 i;
  u32 size;
  u8 rgb [3];
  u32 c;
  uint local_20;
  undefined2 local_17;
  undefined1 local_15;
  u32 local_14;
  u32 *local_10;
  
  local_10 = in_RSI;
  bVar2 = IImage::isCompressedFormat(*(ECOLOR_FORMAT *)(in_RDI + 8));
  if (bVar2) {
    os::Printer::log((Printer *)"IImage::fill method doesn\'t work with compressed images.",__x);
    return;
  }
  switch(*(undefined4 *)(in_RDI + 8)) {
  case 0:
    uVar3 = SColor::toA1R5G5B5((SColor *)0x374202);
    local_14 = CONCAT22(uVar3,uVar3);
    break;
  case 1:
    uVar3 = A8R8G8B8toR5G6B5(*local_10);
    local_14 = CONCAT22(uVar3,uVar3);
    break;
  case 2:
    CColorConverter::convert_A8R8G8B8toR8G8B8(local_10,1,&local_17);
    uVar4 = IImage::getImageDataSizeInBytes((IImage *)0x37426c);
    for (local_20 = 0; local_20 < uVar4; local_20 = local_20 + 3) {
      lVar1 = *(long *)(in_RDI + 0x18);
      *(undefined2 *)(lVar1 + (ulong)local_20) = local_17;
      *(undefined1 *)(lVar1 + 2 + (ulong)local_20) = local_15;
    }
    return;
  case 3:
    local_14 = *local_10;
    break;
  default:
    goto switchD_003741f6_default;
  }
  uVar4 = local_14;
  dest = *(void **)(in_RDI + 0x18);
  uVar5 = IImage::getImageDataSizeInBytes((IImage *)0x3742cc);
  memset32(dest,uVar4,(ulong)uVar5);
switchD_003741f6_default:
  return;
}

Assistant:

void CImage::fill(const SColor &color)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::fill method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	u32 c;

	switch (Format) {
	case ECF_A1R5G5B5:
		c = color.toA1R5G5B5();
		c |= c << 16;
		break;
	case ECF_R5G6B5:
		c = video::A8R8G8B8toR5G6B5(color.color);
		c |= c << 16;
		break;
	case ECF_A8R8G8B8:
		c = color.color;
		break;
	case ECF_R8G8B8: {
		u8 rgb[3];
		CColorConverter::convert_A8R8G8B8toR8G8B8(&color, 1, rgb);
		const u32 size = getImageDataSizeInBytes();
		for (u32 i = 0; i < size; i += 3) {
			memcpy(Data + i, rgb, 3);
		}
		return;
	} break;
	default:
		// TODO: Handle other formats
		return;
	}
	memset32(Data, c, getImageDataSizeInBytes());
}